

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprListSetName(Parse *pParse,ExprList *pList,Token *pName,int dequote)

{
  ExprList_item *pEVar1;
  char *pcVar2;
  int iVar3;
  ExprList_item *pItem;
  int dequote_local;
  Token *pName_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  if (pList != (ExprList *)0x0) {
    pEVar1 = pList->a;
    iVar3 = pList->nExpr + -1;
    pcVar2 = sqlite3DbStrNDup(pParse->db,pName->z,pName->n);
    pEVar1[iVar3].zName = pcVar2;
    if ((dequote != 0) && (pEVar1[iVar3].zName != (char *)0x0)) {
      sqlite3Dequote(pEVar1[iVar3].zName);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprListSetName(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to add the span. */
  Token *pName,           /* Name to be added */
  int dequote             /* True to cause the name to be dequoted */
){
  assert( pList!=0 || pParse->db->mallocFailed!=0 );
  if( pList ){
    struct ExprList_item *pItem;
    assert( pList->nExpr>0 );
    pItem = &pList->a[pList->nExpr-1];
    assert( pItem->zName==0 );
    pItem->zName = sqlite3DbStrNDup(pParse->db, pName->z, pName->n);
    if( dequote && pItem->zName ) sqlite3Dequote(pItem->zName);
  }
}